

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O1

void __thiscall QPrintDialogPrivate::QPrintDialogPrivate(QPrintDialogPrivate *this)

{
  QDialogPrivate::QDialogPrivate((QDialogPrivate *)this);
  (this->super_QAbstractPrintDialogPrivate).printer = (QPrinter *)0x0;
  (this->super_QAbstractPrintDialogPrivate).pd = (QPrinterPrivate *)0x0;
  (this->super_QAbstractPrintDialogPrivate).receiverToDisconnectOnClose.wp.d = (Data *)0x0;
  (this->super_QAbstractPrintDialogPrivate).receiverToDisconnectOnClose.wp.value = (QObject *)0x0;
  (this->super_QAbstractPrintDialogPrivate).memberToDisconnectOnClose.d.d = (Data *)0x0;
  (this->super_QAbstractPrintDialogPrivate).memberToDisconnectOnClose.d.ptr = (char *)0x0;
  (this->super_QAbstractPrintDialogPrivate).memberToDisconnectOnClose.d.size = 0;
  (this->super_QAbstractPrintDialogPrivate).options =
       (QFlagsStorageHelper<QAbstractPrintDialog::PrintDialogOption,_4>)0x1d;
  (this->super_QAbstractPrintDialogPrivate).minPage = 0;
  (this->super_QAbstractPrintDialogPrivate).maxPage = 0x7fffffff;
  (this->super_QAbstractPrintDialogPrivate).ownsPrinter = false;
  *(undefined ***)&this->super_QAbstractPrintDialogPrivate = &PTR__QPrintDialogPrivate_00167628;
  this->top = (QUnixPrintWidget *)0x0;
  this->bottom = (QWidget *)0x0;
  this->buttons = (QDialogButtonBox *)0x0;
  this->collapseButton = (QPushButton *)0x0;
  this->explicitDuplexMode = DuplexAuto;
  qInitResources_qprintdialog();
  return;
}

Assistant:

QPrintDialogPrivate::QPrintDialogPrivate()
    : top(nullptr), bottom(nullptr), buttons(nullptr), collapseButton(nullptr),
      explicitDuplexMode(QPrint::DuplexAuto)
{
    _q_pdu_initResources();
}